

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O3

yajl_gen_status yajl_gen_null(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  size_t sVar3;
  yajl_gen_state yVar4;
  uint _i;
  uint uVar5;
  char *pcVar6;
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) != 0) {
      pcVar6 = " ";
LAB_00105863:
      (*g->print)(g->ctx,pcVar6,1);
    }
    break;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) != 0) {
      pcVar6 = "\n";
      goto LAB_00105863;
    }
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  if (((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val && (ulong)g->depth != 0)) {
    uVar5 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar6 = g->indentString;
      sVar3 = strlen(pcVar6);
      (*p_Var1)(pvVar2,pcVar6,sVar3 & 0xffffffff);
      uVar5 = uVar5 + 1;
    } while (uVar5 < g->depth);
  }
  (*g->print)(g->ctx,"null",4);
  uVar5 = g->depth;
  yVar4 = g->state[uVar5];
  switch(yVar4) {
  case yajl_gen_start:
    g->state[uVar5] = yajl_gen_complete;
    if ((g->flags & 1) == 0) {
      return yajl_gen_status_ok;
    }
    goto LAB_00105926;
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    yVar4 = yajl_gen_map_val;
    break;
  case yajl_gen_map_val:
    yVar4 = yajl_gen_map_key;
    break;
  case yajl_gen_array_start:
    yVar4 = yajl_gen_in_array;
    break;
  default:
    goto switchD_001058e9_default;
  }
  g->state[uVar5] = yVar4;
switchD_001058e9_default:
  if (((g->flags & 1) != 0) && (yVar4 == yajl_gen_complete)) {
LAB_00105926:
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_null(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "null", strlen("null"));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}